

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O2

void __thiscall QDialogPrivate::setDefault(QDialogPrivate *this,QPushButton *pushButton)

{
  QWidget *this_00;
  QWidget *this_01;
  Data *pDVar1;
  bool bVar2;
  QWidget *pQVar3;
  int i;
  undefined1 *puVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QPushButton_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QPushButton **)&DAT_aaaaaaaaaaaaaaaa;
  QObject::findChildren<QPushButton*>
            ((QList<QPushButton_*> *)&local_58,&this_00->super_QObject,(FindChildOptions)0x1);
  bVar2 = false;
  for (puVar4 = (undefined1 *)0x0; puVar4 < (ulong)local_58.size; puVar4 = puVar4 + 1) {
    this_01 = (QWidget *)local_58.ptr[(long)puVar4];
    pQVar3 = QWidget::window(this_01);
    if (pQVar3 == this_00) {
      pDVar1 = (this->mainDef).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar3 = (QWidget *)0x0;
      }
      else {
        pQVar3 = (QWidget *)(this->mainDef).wp.value;
      }
      if (pQVar3 == this_01) {
        bVar2 = true;
      }
      if (this_01 != (QWidget *)pushButton) {
        QPushButton::setDefault((QPushButton *)this_01,false);
      }
    }
  }
  if (pushButton == (QPushButton *)0x0) {
    if (bVar2) {
      QPushButton::setDefault((QPushButton *)(this->mainDef).wp.value,true);
      goto LAB_004924b5;
    }
  }
  else if (bVar2) goto LAB_004924b5;
  QWeakPointer<QObject>::assign<QObject>(&(this->mainDef).wp,(QObject *)pushButton);
LAB_004924b5:
  QArrayDataPointer<QPushButton_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialogPrivate::setDefault(QPushButton *pushButton)
{
    Q_Q(QDialog);
    bool hasMain = false;
    QList<QPushButton*> list = q->findChildren<QPushButton*>();
    for (int i=0; i<list.size(); ++i) {
        QPushButton *pb = list.at(i);
        if (pb->window() == q) {
            if (pb == mainDef)
                hasMain = true;
            if (pb != pushButton)
                pb->setDefault(false);
        }
    }
    if (!pushButton && hasMain)
        mainDef->setDefault(true);
    if (!hasMain)
        mainDef = pushButton;
}